

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O0

int BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transform_idx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint local_78;
  int suffix_len;
  int step_1;
  uint8_t *shift;
  uint16_t local_60;
  uint16_t param;
  int step;
  uint8_t *uppercase;
  int skip;
  int i;
  int t;
  int prefix_len;
  uint8_t *suffix;
  byte *pbStack_38;
  uint8_t type;
  uint8_t *prefix;
  int idx;
  int transform_idx_local;
  BrotliTransforms *transforms_local;
  uint8_t *puStack_18;
  int len_local;
  uint8_t *word_local;
  uint8_t *dst_local;
  
  prefix._0_4_ = 0;
  pbStack_38 = transforms->prefix_suffix +
               transforms->prefix_suffix_map[transforms->transforms[transform_idx * 3]];
  bVar1 = transforms->transforms[transform_idx * 3 + 1];
  _t = transforms->prefix_suffix +
       transforms->prefix_suffix_map[transforms->transforms[transform_idx * 3 + 2]];
  i = (uint)*pbStack_38;
  while( true ) {
    pbStack_38 = pbStack_38 + 1;
    if (i == 0) break;
    dst[(int)prefix] = *pbStack_38;
    i = i + -1;
    prefix._0_4_ = (int)prefix + 1;
  }
  uVar3 = (uint)bVar1;
  uppercase._4_4_ = 0;
  puStack_18 = word;
  if (uVar3 < 10) {
    transforms_local._4_4_ = len - uVar3;
  }
  else {
    transforms_local._4_4_ = len;
    if ((0xb < uVar3) && (uVar3 < 0x15)) {
      puStack_18 = word + (int)(uVar3 - 0xb);
      transforms_local._4_4_ = len - (uVar3 - 0xb);
    }
  }
  while (uppercase._4_4_ < transforms_local._4_4_) {
    dst[(int)prefix] = puStack_18[uppercase._4_4_];
    uppercase._4_4_ = uppercase._4_4_ + 1;
    prefix._0_4_ = (int)prefix + 1;
  }
  if (uVar3 == 10) {
    ToUpperCase(dst + ((int)prefix - transforms_local._4_4_));
  }
  else if (uVar3 == 0xb) {
    _local_60 = dst + ((int)prefix - transforms_local._4_4_);
    for (; 0 < transforms_local._4_4_; transforms_local._4_4_ = transforms_local._4_4_ - iVar4) {
      iVar4 = ToUpperCase(_local_60);
      _local_60 = _local_60 + iVar4;
    }
  }
  else if (uVar3 == 0x15) {
    Shift(dst + ((int)prefix - transforms_local._4_4_),transforms_local._4_4_,
          (ushort)transforms->params[transform_idx << 1] +
          (ushort)transforms->params[transform_idx * 2 + 1] * 0x100);
  }
  else if (uVar3 == 0x16) {
    bVar1 = transforms->params[transform_idx << 1];
    bVar2 = transforms->params[transform_idx * 2 + 1];
    _suffix_len = dst + ((int)prefix - transforms_local._4_4_);
    for (; 0 < transforms_local._4_4_; transforms_local._4_4_ = transforms_local._4_4_ - iVar4) {
      iVar4 = Shift(_suffix_len,transforms_local._4_4_,(ushort)bVar1 + (ushort)bVar2 * 0x100);
      _suffix_len = _suffix_len + iVar4;
    }
  }
  local_78 = (uint)*_t;
  while( true ) {
    _t = _t + 1;
    if (local_78 == 0) break;
    dst[(int)prefix] = *_t;
    local_78 = local_78 - 1;
    prefix._0_4_ = (int)prefix + 1;
  }
  return (int)prefix;
}

Assistant:

int BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* transforms, int transform_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transform_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transform_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transform_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    } else if (t == BROTLI_TRANSFORM_SHIFT_FIRST) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      Shift(&dst[idx - len], len, param);
    } else if (t == BROTLI_TRANSFORM_SHIFT_ALL) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      uint8_t* shift = &dst[idx - len];
      while (len > 0) {
        int step = Shift(shift, len, param);
        shift += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}